

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void __thiscall cppnet::SingletonLogger::SingletonLogger(SingletonLogger *this)

{
  shared_ptr<cppnet::BaseLogger> local_20;
  SingletonLogger *local_10;
  SingletonLogger *this_local;
  
  local_10 = this;
  Singleton<cppnet::SingletonLogger>::Singleton(&this->super_Singleton<cppnet::SingletonLogger>);
  (this->super_Singleton<cppnet::SingletonLogger>)._vptr_Singleton =
       (_func_int **)&PTR__SingletonLogger_00167948;
  std::shared_ptr<cppnet::BaseLogger>::shared_ptr(&this->_logger);
  std::make_shared<cppnet::BaseLogger,unsigned_short_const&,unsigned_short_const&>
            ((unsigned_short *)&local_20,&__log_cache_size);
  std::shared_ptr<cppnet::BaseLogger>::operator=(&this->_logger,&local_20);
  std::shared_ptr<cppnet::BaseLogger>::~shared_ptr(&local_20);
  return;
}

Assistant:

SingletonLogger::SingletonLogger() {
    _logger = std::make_shared<BaseLogger>(__log_cache_size, __log_block_size);
}